

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dblp_std.cpp
# Opt level: O2

XMLElementBody * __thiscall XMLElementBody::operator=(XMLElementBody *this,XMLElementBody *old)

{
  std::__cxx11::string::operator=((string *)this,(string *)old);
  std::
  vector<std::pair<XMLElement,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<XMLElement,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::_M_move_assign(&this->m_elements,&old->m_elements);
  return this;
}

Assistant:

XMLElementBody& operator=(XMLElementBody&& old)
    {
        m_content = std::move(old.m_content);
        m_elements = std::move(old.m_elements);
        return *this;
    }